

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkList(IntegrityCk *pCheck,int isFreeList,Pgno iPage,u32 N)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  u8 *p;
  uint in_ECX;
  uint in_EDX;
  char *pcVar4;
  int in_ESI;
  IntegrityCk *in_RDI;
  long in_FS_OFFSET;
  Pgno iFreePage;
  u32 n;
  uchar *pOvflData;
  int nErrAtStart;
  u32 expected;
  int i;
  DbPage *pOvflPage;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  u32 in_stack_ffffffffffffffc0;
  u32 in_stack_ffffffffffffffc4;
  Pgno pgno;
  int iVar5;
  int local_28;
  uint local_24;
  uint local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = in_RDI->nErr;
  local_24 = in_ECX;
  local_20 = in_EDX;
  while( true ) {
    uVar3 = in_stack_ffffffffffffffbc & 0xffffff;
    if (local_20 != 0) {
      uVar3 = CONCAT13(in_RDI->mxErr != 0,(int3)in_stack_ffffffffffffffbc);
    }
    in_stack_ffffffffffffffbc = uVar3;
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') goto LAB_0019eda9;
    pgno = 0xaaaaaaaa;
    iVar2 = checkRef((IntegrityCk *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0)
    ;
    if (iVar2 != 0) goto LAB_0019eda9;
    uVar3 = local_24 - 1;
    iVar2 = sqlite3PagerGet((Pager *)CONCAT44(in_ECX,iVar5),pgno,
                            (DbPage **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                            ,in_stack_ffffffffffffffbc);
    if (iVar2 != 0) break;
    p = (u8 *)sqlite3PagerGetData((DbPage *)&DAT_aaaaaaaaaaaaaaaa);
    if (in_ESI == 0) {
      local_24 = uVar3;
      if ((in_RDI->pBt->autoVacuum != '\0') && (uVar3 != 0)) {
        sqlite3Get4byte(p);
        checkPtrmap((IntegrityCk *)CONCAT44(in_ECX,iVar5),(Pgno)((ulong)p >> 0x20),
                    (u8)((ulong)p >> 0x18),in_stack_ffffffffffffffc4);
      }
    }
    else {
      in_stack_ffffffffffffffc4 = sqlite3Get4byte(p + 4);
      if (in_RDI->pBt->autoVacuum != '\0') {
        checkPtrmap((IntegrityCk *)CONCAT44(in_ECX,iVar5),(Pgno)((ulong)p >> 0x20),
                    (u8)((ulong)p >> 0x18),in_stack_ffffffffffffffc4);
      }
      if ((in_RDI->pBt->usableSize >> 2) - 2 < in_stack_ffffffffffffffc4) {
        checkAppendMsg(in_RDI,"freelist leaf count too big on page %u",(ulong)local_20);
        local_24 = local_24 - 2;
      }
      else {
        for (local_28 = 0; local_28 < (int)in_stack_ffffffffffffffc4; local_28 = local_28 + 1) {
          in_stack_ffffffffffffffc0 = sqlite3Get4byte(p + (local_28 * 4 + 8));
          if (in_RDI->pBt->autoVacuum != '\0') {
            checkPtrmap((IntegrityCk *)CONCAT44(in_ECX,iVar5),(Pgno)((ulong)p >> 0x20),
                        (u8)((ulong)p >> 0x18),in_stack_ffffffffffffffc4);
          }
          checkRef((IntegrityCk *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
        }
        local_24 = uVar3 - in_stack_ffffffffffffffc4;
      }
    }
    local_20 = sqlite3Get4byte(p);
    sqlite3PagerUnref((DbPage *)0x19eda4);
  }
  checkAppendMsg(in_RDI,"failed to get page %u",(ulong)local_20);
  local_24 = uVar3;
LAB_0019eda9:
  if ((local_24 != 0) && (iVar5 == in_RDI->nErr)) {
    pcVar4 = "overflow list length";
    if (in_ESI != 0) {
      pcVar4 = "size";
    }
    checkAppendMsg(in_RDI,"%s is %u but should be %u",pcVar4,(ulong)(in_ECX - local_24),
                   (ulong)in_ECX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  Pgno iPage,           /* Page number for first page in the list */
  u32 N                 /* Expected number of pages in the list */
){
  int i;
  u32 expected = N;
  int nErrAtStart = pCheck->nErr;
  while( iPage!=0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( checkRef(pCheck, iPage) ) break;
    N--;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %u", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      u32 n = (u32)get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %u", iPage);
        N--;
      }else{
        for(i=0; i<(int)n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
  if( N && nErrAtStart==pCheck->nErr ){
    checkAppendMsg(pCheck,
      "%s is %u but should be %u",
      isFreeList ? "size" : "overflow list length",
      expected-N, expected);
  }
}